

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

char * __thiscall kj::PathPtr::basename(PathPtr *this,char *__filename)

{
  size_t sVar1;
  size_t end;
  ArrayPtr<const_kj::String> parts;
  Fault local_28;
  Fault f;
  PathPtr *this_local;
  
  f.exception = (Exception *)this;
  sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
  if (sVar1 != 0) {
    sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
    end = ArrayPtr<const_kj::String>::size(&this->parts);
    parts = ArrayPtr<const_kj::String>::slice(&this->parts,sVar1 - 1,end);
    PathPtr((PathPtr *)&this_local,parts);
    return (char *)this_local;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x70,FAILED,"parts.size() > 0","\"root path has no basename\"",
             (char (*) [26])"root path has no basename");
  _::Debug::Fault::fatal(&local_28);
}

Assistant:

PathPtr PathPtr::basename() const {
  KJ_REQUIRE(parts.size() > 0, "root path has no basename");
  return PathPtr(parts.slice(parts.size() - 1, parts.size()));
}